

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluDeriveDisjoint4
               (word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r,word *pTruth0,
               word *pTruth1)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  word wVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong local_3038 [256];
  long local_2838;
  ulong local_2038;
  long local_1838;
  ulong local_1038;
  ulong local_838;
  
  iVar5 = (int)g->nVars;
  if (iVar5 < 7) {
    uVar10 = nVars - iVar5;
    if ((int)uVar10 < 5) {
      iVar5 = If_CluCountCofs4(pF,nVars,iVar5,(word (*) [256])local_3038);
      if (iVar5 - 5U < 0xfffffffe) {
        puts("If_CluDeriveDisjoint4(): Error!!!");
      }
      bVar2 = (byte)(1 << ((byte)uVar10 & 0x1f));
      wVar6 = (local_1838 << (bVar2 & 0x3f) | local_2038) <<
              ((byte)(1 << ((byte)uVar10 + 1 & 0x1f)) & 0x3f) |
              local_2838 << (bVar2 & 0x3f) | local_3038[0];
      *pF = wVar6;
      uVar1 = uVar10 + 2;
      if (uVar1 < 7) {
        if (uVar1 != 6) {
          bVar2 = (byte)(1 << ((byte)uVar1 & 0x1f));
          uVar7 = wVar6 & ~(-1L << (bVar2 & 0x3f));
          uVar4 = 0;
          uVar9 = uVar7 << (bVar2 & 0x3f);
          if (uVar1 != 0) {
            uVar9 = uVar4;
          }
          uVar9 = uVar9 | uVar7;
          uVar7 = uVar9 * 4;
          if (uVar10 < 0xfffffffe) {
            uVar7 = uVar4;
          }
          iVar5 = 2;
          if (uVar10 < 0xfffffffe) {
            iVar5 = uVar1 + (uVar1 == 0);
          }
          uVar7 = uVar7 | uVar9;
          uVar9 = uVar7 << 4;
          if (iVar5 != 2) {
            uVar9 = uVar4;
          }
          iVar8 = 3;
          if (iVar5 != 2) {
            iVar8 = iVar5;
          }
          uVar9 = uVar9 | uVar7;
          uVar7 = uVar9 << 8;
          if (iVar8 != 3) {
            uVar7 = uVar4;
          }
          uVar7 = uVar7 | uVar9;
          uVar9 = uVar7 << 0x10;
          if (1 < iVar8 - 3U) {
            uVar9 = uVar4;
          }
          uVar9 = uVar9 | uVar7;
          wVar6 = uVar9 << 0x20 | uVar9;
        }
        *pF = wVar6;
        r->nVars = (byte)uVar1;
        r->nMyu = '\0';
        if (0 < (int)uVar10) {
          uVar9 = 0;
          do {
            r->pVars[uVar9] = (char)P2V[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
        r->pVars[(int)uVar10] = (char)nVars;
        r->pVars[(long)(int)uVar10 + 1] = (char)nVars + '\x01';
        bVar2 = g->nVars;
        uVar10 = (uint)(char)bVar2;
        if (uVar10 < 7) {
          if (bVar2 != 6) {
            bVar3 = (byte)(1 << (bVar2 & 0x1f));
            local_1038 = local_1038 & ~(-1L << (bVar3 & 0x3f));
            uVar4 = 0;
            uVar9 = local_1038 << (bVar3 & 0x3f);
            if (bVar2 != 0) {
              uVar9 = uVar4;
            }
            uVar9 = uVar9 | local_1038;
            uVar7 = uVar9 * 4;
            if (1 < bVar2) {
              uVar7 = uVar4;
            }
            iVar5 = 2;
            if (1 < bVar2) {
              iVar5 = uVar10 + (uVar10 == 0);
            }
            uVar7 = uVar7 | uVar9;
            uVar9 = uVar7 << 4;
            if (iVar5 != 2) {
              uVar9 = uVar4;
            }
            iVar8 = 3;
            if (iVar5 != 2) {
              iVar8 = iVar5;
            }
            uVar9 = uVar9 | uVar7;
            uVar7 = uVar9 << 8;
            if (iVar8 != 3) {
              uVar7 = uVar4;
            }
            uVar7 = uVar7 | uVar9;
            local_1038 = uVar7 << 0x10;
            if (1 < iVar8 - 3U) {
              local_1038 = uVar4;
            }
            local_1038 = local_1038 | uVar7;
            local_1038 = local_1038 << 0x20 | local_1038;
          }
          *pTruth0 = local_1038;
          if (bVar2 != 6) {
            bVar3 = (byte)(1 << (bVar2 & 0x1f));
            local_838 = local_838 & ~(-1L << (bVar3 & 0x3f));
            uVar4 = 0;
            uVar9 = local_838 << (bVar3 & 0x3f);
            if (bVar2 != 0) {
              uVar9 = uVar4;
            }
            uVar9 = uVar9 | local_838;
            uVar7 = uVar9 * 4;
            if (1 < bVar2) {
              uVar7 = uVar4;
            }
            iVar5 = 2;
            if (1 < bVar2) {
              iVar5 = uVar10 + (uVar10 == 0);
            }
            uVar7 = uVar7 | uVar9;
            uVar9 = uVar7 << 4;
            if (iVar5 != 2) {
              uVar9 = uVar4;
            }
            iVar8 = 3;
            if (iVar5 != 2) {
              iVar8 = iVar5;
            }
            uVar9 = uVar9 | uVar7;
            uVar7 = uVar9 << 8;
            if (iVar8 != 3) {
              uVar7 = uVar4;
            }
            uVar7 = uVar7 | uVar9;
            local_838 = uVar7 << 0x10;
            if (1 < iVar8 - 3U) {
              local_838 = uVar4;
            }
            local_838 = local_838 | uVar7;
            local_838 = local_838 << 0x20 | local_838;
          }
          *pTruth1 = local_838;
          return;
        }
      }
      __assert_fail("nVars >= 0 && nVars <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x174,"word If_CluAdjust(word, int)");
    }
  }
  __assert_fail("g->nVars <= 6 && nFSset <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x4be,
                "void If_CluDeriveDisjoint4(word *, int, int *, int *, If_Grp_t *, If_Grp_t *, word *, word *)"
               );
}

Assistant:

void If_CluDeriveDisjoint4( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r, word * pTruth0, word * pTruth1 )
{
    word pCofs[6][CLU_WRD_MAX/4];
    word Cof0, Cof1;
    int i, RetValue, nFSset = nVars - g->nVars;

    assert( g->nVars <= 6 && nFSset <= 4 );

    RetValue = If_CluCountCofs4( pF, nVars, g->nVars, pCofs );
    if ( RetValue != 3 && RetValue != 4 )
        printf( "If_CluDeriveDisjoint4(): Error!!!\n" );

    Cof0  = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    Cof1  = (pCofs[3][0] << (1 << nFSset)) | pCofs[2][0];
    pF[0] = (Cof1 << (1 << (nFSset+1))) | Cof0;
    pF[0] = If_CluAdjust( pF[0], nFSset + 2 );

    // create the resulting group
    r->nVars = nFSset + 2;
    r->nMyu = 0;
    for ( i = 0; i < nFSset; i++ )
        r->pVars[i] = P2V[i];
    r->pVars[nFSset] = nVars;
    r->pVars[nFSset+1] = nVars+1;

    *pTruth0 = If_CluAdjust( pCofs[4][0], g->nVars );
    *pTruth1 = If_CluAdjust( pCofs[5][0], g->nVars );
}